

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O3

void __thiscall
wasm::DeNaN::addFunc
          (DeNaN *this,Module *module,Name name,Type type,Literal *literal,
          optional<wasm::BinaryOp> op)

{
  MixedArena *pMVar1;
  Expression *pEVar2;
  SIMDExtract *pSVar3;
  SIMDExtract *pSVar4;
  Binary *pBVar5;
  Binary *pBVar6;
  Binary *pBVar7;
  Expression *pEVar8;
  Const *pCVar9;
  If *this_00;
  ulong uVar10;
  Signature sig;
  optional<wasm::Type> type_;
  Name name_00;
  HeapType local_98;
  Literal local_90;
  void *local_78;
  Type TStack_70;
  long local_68;
  Literal *local_60;
  Binary *local_58;
  Builder local_50;
  Builder builder;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  sig.results.id = type.id;
  sig.params.id = type.id;
  local_60 = literal;
  local_50.wasm = module;
  builder.wasm = (Module *)type.id;
  HeapType::HeapType(&local_98,sig);
  local_78 = (void *)0x0;
  TStack_70.id = 0;
  local_68 = 0;
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name_00,(HeapType)name.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98.id,(Expression *)&local_78)
  ;
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (builder.wasm == (Module *)0x6) {
    if (((ulong)op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::BinaryOp> >> 0x20 & 1) != 0) {
      __assert_fail("!op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xab,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    pMVar1 = &module->allocator;
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar3 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar2;
    SIMDExtract::finalize(pSVar3);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar4 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar4->op = 0;
    pSVar4->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar4->index = 0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar4->op = ExtractLaneVecF32x4;
    pSVar4->vec = pEVar2;
    SIMDExtract::finalize(pSVar4);
    pBVar5 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar5->op = EqFloat32;
    pBVar5->left = (Expression *)pSVar3;
    pBVar5->right = (Expression *)pSVar4;
    Binary::finalize(pBVar5);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar3 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar2;
    pSVar3->index = '\x01';
    SIMDExtract::finalize(pSVar3);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar4 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar4->op = 0;
    pSVar4->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar4->index = 0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar4->op = ExtractLaneVecF32x4;
    pSVar4->vec = pEVar2;
    pSVar4->index = '\x01';
    SIMDExtract::finalize(pSVar4);
    pBVar6 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar6->op = EqFloat32;
    pBVar6->left = (Expression *)pSVar3;
    pBVar6->right = (Expression *)pSVar4;
    Binary::finalize(pBVar6);
    pBVar7 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = AndInt32;
    pBVar7->left = (Expression *)pBVar5;
    pBVar7->right = (Expression *)pBVar6;
    Binary::finalize(pBVar7);
    local_58 = pBVar7;
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar3 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar2;
    pSVar3->index = '\x02';
    SIMDExtract::finalize(pSVar3);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar4 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar4->op = 0;
    pSVar4->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar4->index = 0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar4->op = ExtractLaneVecF32x4;
    pSVar4->vec = pEVar2;
    pSVar4->index = '\x02';
    SIMDExtract::finalize(pSVar4);
    pBVar5 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar5->op = EqFloat32;
    pBVar5->left = (Expression *)pSVar3;
    pBVar5->right = (Expression *)pSVar4;
    Binary::finalize(pBVar5);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar3 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar2;
    pSVar3->index = '\x03';
    SIMDExtract::finalize(pSVar3);
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = 6;
    pSVar4 = (SIMDExtract *)MixedArena::allocSpace(pMVar1,0x28,8);
    *(undefined8 *)&(pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar4->op = 0;
    pSVar4->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar4->index = 0;
    (pSVar4->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    pSVar4->op = ExtractLaneVecF32x4;
    pSVar4->vec = pEVar2;
    pSVar4->index = '\x03';
    SIMDExtract::finalize(pSVar4);
    pBVar6 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar6->op = EqFloat32;
    pBVar6->left = (Expression *)pSVar3;
    pBVar6->right = (Expression *)pSVar4;
    Binary::finalize(pBVar6);
    pBVar7 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = AndInt32;
    pBVar7->left = (Expression *)pBVar5;
    pBVar7->right = (Expression *)pBVar6;
    Binary::finalize(pBVar7);
    pBVar5 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar5->op = AndInt32;
    pBVar5->left = (Expression *)local_58;
    pBVar5->right = (Expression *)pBVar7;
    Binary::finalize(pBVar5);
  }
  else {
    if (((ulong)op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::BinaryOp> >> 0x20 & 1) == 0) {
      __assert_fail("op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xa7,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    pMVar1 = &module->allocator;
    pEVar2 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar2->_id = LocalGetId;
    *(undefined4 *)(pEVar2 + 1) = 0;
    (pEVar2->type).id = (uintptr_t)builder.wasm;
    pEVar8 = (Expression *)MixedArena::allocSpace(pMVar1,0x18,8);
    pEVar8->_id = LocalGetId;
    *(undefined4 *)(pEVar8 + 1) = 0;
    (pEVar8->type).id = (uintptr_t)builder.wasm;
    pBVar5 = (Binary *)MixedArena::allocSpace(pMVar1,0x28,8);
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar5->op = op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::BinaryOp>._M_payload;
    pBVar5->left = pEVar2;
    pBVar5->right = pEVar8;
    Binary::finalize(pBVar5);
  }
  pEVar2 = (Expression *)MixedArena::allocSpace(&module->allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  *(undefined4 *)(pEVar2 + 1) = 0;
  (pEVar2->type).id = (uintptr_t)builder.wasm;
  Literal::Literal(&local_90,local_60);
  pCVar9 = Builder::makeConst(&local_50,&local_90);
  uVar10 = 0x28;
  this_00 = (If *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_00->condition = (Expression *)pBVar5;
  this_00->ifTrue = pEVar2;
  this_00->ifFalse = (Expression *)pCVar9;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
  If::finalize(this_00,type_);
  (local_38._M_head_impl)->body = (Expression *)this_00;
  Literal::~Literal(&local_90);
  Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                             &local_38);
  if (local_38._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
  }
  return;
}

Assistant:

void addFunc(Module* module,
               Name name,
               Type type,
               Literal literal,
               std::optional<BinaryOp> op = {}) {
    Builder builder(*module);
    auto func = Builder::makeFunction(name, Signature(type, type), {});
    // Compare the value to itself to check if it is a NaN, and return 0 if
    // so:
    //
    //   (if (result f*)
    //     (f*.eq
    //       (local.get $0)
    //       (local.get $0)
    //     )
    //     (local.get $0)
    //     (f*.const 0)
    //   )
    Expression* condition;
    if (type != Type::v128) {
      // Generate a simple condition.
      assert(op);
      condition = builder.makeBinary(
        *op, builder.makeLocalGet(0, type), builder.makeLocalGet(0, type));
    } else {
      assert(!op);
      // v128 is trickier as the 128 bits may contain f32s or f64s, and we
      // need to check for nans both ways in principle. However, the f32 NaN
      // pattern is a superset of f64, since it checks less bits (8 bit
      // exponent vs 11), and it is checked in more places (4 32-bit values vs
      // 2 64-bit ones), so we can just check that. That is, this reduces to 4
      // checks of f32s, but is otherwise the same as a check of a single f32.
      //
      // However there is additional complexity, which is that if we do
      // EqVecF32x4 then we get all-1s for each case where we compare equal.
      // That itself is a NaN pattern, which means that running this pass
      // twice would interfere with itself. To avoid that we'd need a way to
      // detect our previous instrumentation and not instrument it, but that
      // is tricky (we can't depend on function names etc. while fuzzing).
      // Instead, extract the lanes and use f32 checks.
      auto getLane = [&](Index index) {
        return builder.makeSIMDExtract(
          ExtractLaneVecF32x4, builder.makeLocalGet(0, type), index);
      };
      auto getLaneCheck = [&](Index index) {
        return builder.makeBinary(EqFloat32, getLane(index), getLane(index));
      };
      auto* firstTwo =
        builder.makeBinary(AndInt32, getLaneCheck(0), getLaneCheck(1));
      auto* lastTwo =
        builder.makeBinary(AndInt32, getLaneCheck(2), getLaneCheck(3));
      condition = builder.makeBinary(AndInt32, firstTwo, lastTwo);
    }
    func->body = builder.makeIf(
      condition, builder.makeLocalGet(0, type), builder.makeConst(literal));
    module->addFunction(std::move(func));
  }